

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

void balloc_after(AR *ar,Pointer address,Pointer *client_space,ulongi *nbytes)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  Pointer pcVar4;
  int iVar5;
  
  lVar2 = ar->nelem;
  uVar1 = ma_sizeof[ar->datatype];
  iVar5 = (int)((ulong)(ma_base[ar->datatype] + (-0x54 - (long)address)) % (ulong)(long)(int)uVar1);
  pcVar4 = address + (long)(int)((iVar5 >> 0x1f & uVar1) + iVar5) + 0x54;
  if (0 < ma_numalign) {
    iVar5 = 1 << ((byte)ma_numalign & 0x1f);
    uVar3 = (uint)pcVar4 & iVar5 - 1U;
    if ((uVar3 != 0) && (iVar5 = iVar5 - uVar3, iVar5 % (int)uVar1 == 0)) {
      pcVar4 = pcVar4 + iVar5;
    }
  }
  *client_space = pcVar4;
  *nbytes = (ulongi)(pcVar4 + lVar2 * (int)uVar1 +
                    (((ulong)((int)address - (int)(pcVar4 + lVar2 * (int)uVar1) & 7) ^ 4) -
                    (long)address) + 4);
  return;
}

Assistant:

private void balloc_after(ar, address, client_space, nbytes)
    AR        *ar;        /* allocation request */
    Pointer    address;    /* to allocate after */
    Pointer    *client_space;    /* RETURN: location of client_space */
    ulongi    *nbytes;    /* RETURN: length of block */
{
    Integer    datatype;    /* of elements in this block */
    ulongi    L_client_space;    /* length of client_space */
    Pointer    A_client_space;    /* address of client_space */
    int        L_gap1;        /* length of gap1 */
    int        L_gap2;        /* length of gap2 */

    ulongi    B_address;    /* byte equivalent of address */
    ulongi    B_base;        /* byte equivalent of ma_base[datatype] */
    ulongi    B_client_space;    /* byte equivalent of A_client_space */

    datatype = ar->datatype;

    B_address = p2b(address);
    B_base = p2b(ma_base[datatype]);

    /*
     * To ensure that client_space is properly aligned:
     *
     *    (A(client_space) - ma_base[datatype]) % ma_sizeof[datatype] == 0
     *
     * where
     *
     *    A(client_space) == address + L(AD) + L(gap1) + L(guard1)
     */

    L_client_space = ar->nelem * ma_sizeof[datatype];

    L_gap1 = ((size_t)B_base
        - (size_t)B_address
        - (size_t)sizeof(AD)
        - (size_t)sizeof(Guard))
        % (size_t)ma_sizeof[datatype];

    if (L_gap1 < 0)
        L_gap1 += ma_sizeof[datatype];

    B_client_space = B_address + sizeof(AD) + L_gap1 + sizeof(Guard);
    A_client_space = b2p(B_client_space);
    B_client_space = p2b(A_client_space);

    /*
     * To align client space according to overall alignment of absolute
     * address on user requested 2^ma_numalign boundary.
     * Note that if the base arrays are not aligned accordingly then
     * this alignement request is not satisfiable and will be quietly
     * ignored.
     */

    if (ma_numalign > 0) {
      size_t mask = (1<<ma_numalign)-1;
      int diff = ((size_t) B_client_space) & mask;
      
      /* Check that the difference is a multiple of the type size.
       * If so, then we can shift the client space which is already
       * aligned to satisfy this requirement.
       */

      if (diff) {
    diff = (1<<ma_numalign) - diff;
    if ((diff % ma_sizeof[datatype]) == 0 ) {
      /*printf("bafter realigned diff=%d\n",diff);*/
      A_client_space = b2p(B_client_space + diff);
      B_client_space = p2b(A_client_space);
    }    
    /*    else {
      printf("did not realign diff=%d typelen=%d mod=%d\n",
         diff, ma_sizeof[datatype], (diff % ma_sizeof[datatype]));
         }*/
      }
    }

    /*
     * To ensure that the AD is properly aligned:
     *
     *    L(block) % ALIGNMENT == 0
     *
     * where
     *
     *    L(block) == A(client_space) + L(client_space) + L(guard2) + L(gap2)
     *        - address
     */

    L_gap2 = ((size_t)B_address
        - (size_t)B_client_space
        - (size_t)L_client_space
        - (size_t)sizeof(Guard))
        % (size_t)ALIGNMENT;

    if (L_gap2 < 0)
        L_gap2 += ALIGNMENT;

    /*
     * set the return values
     */

    *client_space = A_client_space;
    *nbytes = (ulongi)(B_client_space
        + L_client_space
        + sizeof(Guard)
        + L_gap2
        - B_address);
}